

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O0

int TRD_PrepareIncFile(fullpath_ref_t trd,char *filename,aint *offset,aint *length)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  path local_a28;
  int local_a00;
  int local_9fc;
  aint fileEnd;
  aint fileOffset;
  STrdFile *entry;
  byte *local_9c8;
  STrdFile *entry_1;
  char *pcStack_9b8;
  uint fileIndex;
  path local_9b0;
  char *local_978;
  path local_970;
  FILE *local_948;
  FILE *ff;
  STrdHead trdHead;
  int Lname;
  byte trdFormName [12];
  aint *length_local;
  aint *offset_local;
  char *filename_local;
  fullpath_ref_t trd_local;
  
  trdHead.info.label[3] = '\0';
  trdHead.info.label[4] = '\0';
  trdHead.info.label[5] = '\0';
  trdHead.info.label[6] = '\0';
  offset_local = (aint *)filename;
  filename_local = (char *)trd;
  TRD_FileNameToBytes(filename,trdHead.info.label + 7,(int *)(trdHead.info.label + 3));
  STrdHead::STrdHead((STrdHead *)&ff);
  local_948 = (FILE *)SJ_fopen((path *)filename_local,"rb");
  if (local_948 == (FILE *)0x0) {
    local_978 = (char *)std::__cxx11::string::c_str();
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_970,&local_978,auto_format);
    trd_local._4_4_ = ReturnWithError("[INCTRD] Error opening file",&local_970,(FILE *)local_948);
    std::filesystem::__cxx11::path::~path(&local_970);
  }
  else {
    bVar1 = STrdHead::readFromFile((STrdHead *)&ff,(FILE *)local_948);
    if (bVar1) {
      fclose(local_948);
      local_948 = (FILE *)0x0;
      for (entry_1._4_4_ = 0; entry_1._4_4_ < 0x80; entry_1._4_4_ = entry_1._4_4_ + 1) {
        local_9c8 = &trdHead.catalog[(ulong)entry_1._4_4_ - 1].ext;
        if (*local_9c8 == '\0') {
          entry_1._4_4_ = 0x80;
          break;
        }
        iVar2 = memcmp(local_9c8,trdHead.info.label + 7,(long)(int)trdHead.info.label._3_4_);
        if (iVar2 == 0) break;
      }
      if (entry_1._4_4_ == 0x80) {
        std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                  ((path *)&entry,(char **)&offset_local,auto_format);
        trd_local._4_4_ =
             ReturnWithError("[INCTRD] File not found in TRD image",(path *)&entry,(FILE *)local_948
                            );
        std::filesystem::__cxx11::path::~path((path *)&entry);
      }
      else {
        uVar4 = (ulong)entry_1._4_4_;
        _fileEnd = &trdHead.catalog[uVar4 - 1].ext;
        if (*length == 0x7fffffff) {
          *length = (uint)*(ushort *)(trdHead.catalog[uVar4].filename + 3);
          *length = *length - *offset;
        }
        lVar3 = STrdDisc::fileOffset
                          ((ulong)trdHead.catalog[uVar4].filename[7],
                           (ulong)trdHead.catalog[uVar4].filename[6]);
        local_9fc = (int)lVar3;
        local_a00 = local_9fc + (uint)*(ushort *)(_fileEnd + 0xb);
        *offset = local_9fc + *offset;
        if (((*offset < local_9fc) || (local_a00 < *offset + *length)) || (*length < 1)) {
          std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
                    (&local_a28,&bp,auto_format);
          trd_local._4_4_ =
               ReturnWithError("[INCTRD] File too short to cover requested offset and length",
                               &local_a28,(FILE *)local_948);
          std::filesystem::__cxx11::path::~path(&local_a28);
        }
        else {
          trd_local._4_4_ = 1;
        }
      }
    }
    else {
      pcStack_9b8 = (char *)std::__cxx11::string::c_str();
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                (&local_9b0,&stack0xfffffffffffff648,auto_format);
      trd_local._4_4_ = ReturnWithError("TRD image read error",&local_9b0,(FILE *)local_948);
      std::filesystem::__cxx11::path::~path(&local_9b0);
    }
  }
  return trd_local._4_4_;
}

Assistant:

int TRD_PrepareIncFile(fullpath_ref_t trd, const char* filename, aint & offset, aint & length) {
	// parse filename into TRD file form (max 8+3, don't warn about 3-letter extension)
	byte trdFormName[12];
	int Lname = 0;
	TRD_FileNameToBytes(filename, trdFormName, Lname);	// ignore diagnostic info about extension

	// read 9 sectors of disk into "trdHead" (contains root directory catalog and disk info data)
	STrdHead trdHead;
	FILE* ff = SJ_fopen(trd.full, "rb");
	if (nullptr == ff) return ReturnWithError("[INCTRD] Error opening file", trd.str.c_str(), ff);
	if (!trdHead.readFromFile(ff)) {
		return ReturnWithError("TRD image read error", trd.str.c_str(), ff);
	}
	fclose(ff);
	ff = nullptr;

	// find the requested file
	unsigned fileIndex = 0;
	for (fileIndex = 0; fileIndex < STrdHead::NUM_OF_FILES_MAX; ++fileIndex) {
		const auto & entry = trdHead.catalog[fileIndex];
		if (0 == entry.filename[0]) {	// beyond last FAT record, finish the loop
			fileIndex = STrdHead::NUM_OF_FILES_MAX;
			break;
		} else {
			if (!memcmp(entry.filename, trdFormName, Lname)) break;	// found!
		}
	}
	if (STrdHead::NUM_OF_FILES_MAX == fileIndex) {
		return ReturnWithError("[INCTRD] File not found in TRD image", filename, ff);
	}

	// calculate absolute file offset and length + validate input values
	const auto & entry = trdHead.catalog[fileIndex];
	if (INT_MAX == length) {
		length = entry.length;
		length -= offset;
	}
	const aint fileOffset = STrdDisc::fileOffset(entry.startTrack, entry.startSector);
	const aint fileEnd = fileOffset + entry.length;
	offset += fileOffset;

	// report success when resulting offset + length fits into the file definition
	if (fileOffset <= offset && (offset + length) <= fileEnd && 0 < length) return 1;

	return ReturnWithError("[INCTRD] File too short to cover requested offset and length", bp, ff);
}